

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

MainFunc __thiscall kj::MainBuilder::build(MainBuilder *this)

{
  Iface *extraout_RDX;
  Iface *extraout_RDX_00;
  Iface *pIVar1;
  undefined8 *in_RSI;
  MainFunc MVar2;
  MainImpl local_18;
  
  local_18.impl.disposer = (Disposer *)*in_RSI;
  local_18.impl.ptr = (Impl *)in_RSI[1];
  in_RSI[1] = 0;
  Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::
  Function<kj::MainBuilder::MainImpl>
            ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)this,&local_18);
  pIVar1 = extraout_RDX;
  if (local_18.impl.ptr != (Impl *)0x0) {
    local_18.impl.ptr = (Impl *)0x0;
    (*(code *)**(undefined8 **)local_18.impl.disposer)();
    pIVar1 = extraout_RDX_00;
  }
  MVar2.impl.ptr = pIVar1;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

MainFunc MainBuilder::build() {
  return MainImpl(kj::mv(impl));
}